

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O0

void perf_compute_response_all_layers
               (_func_void_fasthessian_ptr *function,fasthessian *fh,benchmark_data *data)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  iterator __first;
  reference pvVar3;
  undefined8 uVar4;
  long in_RDX;
  undefined8 in_RSI;
  code *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 extraout_var [56];
  undefined1 auVar8 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double flops_per_cycle;
  size_t i_1;
  size_t j;
  double total_cycles;
  vector<double,_std::allocator<double>_> cycleslist;
  size_t i;
  uint64_t end;
  uint64_t start;
  double multiplier;
  long num_runs;
  double cycles;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff48;
  vector<double,_std::allocator<double>_> *this;
  value_type_conflict *in_stack_ffffffffffffff58;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  ulong local_78;
  ulong local_70;
  double local_68;
  vector<double,_std::allocator<double>_> local_60;
  ulong local_48;
  unsigned_long_long local_40;
  unsigned_long_long local_38;
  double local_30;
  ulong local_28;
  double local_20;
  long local_18;
  undefined8 local_10;
  code *local_8;
  
  local_20 = 0.0;
  local_28 = 5;
  local_30 = 1.0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    auVar7 = ZEXT864((ulong)((double)(long)local_28 * local_30));
    local_28 = (ulong)((double)(long)local_28 * local_30);
    local_38 = start_tsc();
    for (local_48 = 0; auVar5 = auVar7._0_16_, local_48 < local_28; local_48 = local_48 + 1) {
      auVar7._0_8_ = (*local_8)(local_10);
      auVar7._8_56_ = extraout_var;
    }
    local_40 = stop_tsc(local_38);
    auVar5 = vcvtusi2sd_avx512f(auVar5,local_40);
    local_20 = auVar5._0_8_;
    local_30 = 100000000.0 / local_20;
  } while (2.0 < local_30);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x10f722);
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  local_68 = 0.0;
  for (local_70 = 0; local_70 < 10; local_70 = local_70 + 1) {
    local_38 = start_tsc();
    for (local_78 = 0; auVar5 = auVar8._0_16_, local_78 < local_28; local_78 = local_78 + 1) {
      auVar8._0_8_ = (*local_8)(local_10);
      auVar8._8_56_ = extraout_var_00;
    }
    local_40 = stop_tsc(local_38);
    auVar5 = vcvtusi2sd_avx512f(auVar5,local_40);
    local_20 = auVar5._0_8_ / (double)(long)local_28;
    local_68 = local_68 + local_20;
    auVar8 = ZEXT864((ulong)local_68);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  local_20 = local_68 / 10.0;
  auVar6._0_8_ = ((double)*(long *)(local_18 + 0x210) * 100.0) / local_20;
  auVar6._8_8_ = 0;
  auVar11._8_8_ = 0x8000000000000000;
  auVar11._0_8_ = 0x8000000000000000;
  auVar9._8_8_ = 0x3fdfffffffffffff;
  auVar9._0_8_ = 0x3fdfffffffffffff;
  auVar5 = vpternlogq_avx512vl(auVar9,auVar6,auVar11,0xf8);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = auVar6._0_8_ + auVar5._0_8_;
  auVar6 = vroundsd_avx(auVar6,auVar10,0xb);
  __last._M_current = (double *)&local_60;
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
  __first = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff48);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __first._M_current,__last);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_20;
  uVar4 = vcvttsd2usi_avx512f(auVar5);
  *(undefined8 *)(local_18 + 0x218) = uVar4;
  this = &local_60;
  pvVar3 = std::vector<double,_std::allocator<double>_>::front(this);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *pvVar3;
  uVar4 = vcvttsd2usi_avx512f(auVar1);
  *(undefined8 *)(local_18 + 0x220) = uVar4;
  pvVar3 = std::vector<double,_std::allocator<double>_>::back(this);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *pvVar3;
  uVar4 = vcvttsd2usi_avx512f(auVar2);
  *(undefined8 *)(local_18 + 0x228) = uVar4;
  *(double *)(local_18 + 0x230) = auVar6._0_8_ / 100.0;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)__first._M_current);
  return;
}

Assistant:

void perf_compute_response_all_layers(void (*function)(struct fasthessian *), struct fasthessian *fh,
                                      struct benchmark_data &data) {
    double cycles = 0.;
    long num_runs = 5;
    double multiplier = 1;
    uint64_t start, end;

#ifdef WARM_UP
    // Warm-up phase: we determine a number of executions that allows
    // the code to be executed for at least CYCLES_REQUIRED cycles.
    // This helps excluding timing overhead when measuring small runtimes.
    do {
        num_runs = num_runs * multiplier;
        start = start_tsc();
        for (size_t i = 0; i < num_runs; i++) {
            // TODO: (carla) should we do a warm up on more than one layer? feels like an overkill.
            (*function)(fh);
        }
        end = stop_tsc(start);

        cycles = (double)end;
        multiplier = (CYCLES_REQUIRED) / (cycles);

    } while (multiplier > 2);
#endif

    std::vector<double> cycleslist;

    // Actual performance measurements repeated REP times.
    // We simply store all results and compute medians during post-processing.
    double total_cycles = 0;
    for (size_t j = 0; j < REP; j++) {
        start = start_tsc();
        for (size_t i = 0; i < num_runs; ++i) {
            (*function)(fh);
        }
        end = stop_tsc(start);

        cycles = ((double)end) / num_runs;
        total_cycles += cycles;

        cycleslist.push_back(cycles);
    }
    total_cycles /= REP;
    // total_cycles /= MAX(1, fh->total_layers);
    cycles = total_cycles;  // cyclesList.front();
    double flops_per_cycle = round((100.0 * data.num_flops) / cycles) / 100.0;
    std::sort(cycleslist.begin(), cycleslist.end());
    data.avg_cycles = (uint64_t)cycles;
    data.min_cycles = (uint64_t)cycleslist.front();  // / MAX(1, fh->total_layers);
    data.max_cycles = (uint64_t)cycleslist.back();   // / MAX(1, fh->total_layers);
    // TODO: (carla) do we have to divide by total_lyers here? the total_cycles have already been divided;
    data.flops_per_cycle = flops_per_cycle;
}